

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

void __thiscall docopt::BranchPattern::fix_repeating_arguments(BranchPattern *this)

{
  bool bVar1;
  int iVar2;
  PatternList *__x;
  __shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *this_00;
  size_type sVar3;
  element_type *peVar4;
  value *pvVar5;
  string *str;
  Option *local_1e8;
  long local_1d8;
  long local_1c8;
  LeafPattern *local_1b8;
  value local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  value local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  undefined1 local_110 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newValue;
  Option *o;
  bool ensureInt;
  bool ensureList;
  LeafPattern *leaf;
  shared_ptr<docopt::Pattern> *e;
  iterator __end2;
  iterator __begin2;
  unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *__range2;
  __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  local_b8;
  __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  local_b0;
  undefined1 local_a8 [8];
  unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  group_set;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *group;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  *__range1;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  local_40;
  undefined1 local_28 [8];
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  either;
  BranchPattern *this_local;
  
  either.
  super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  __x = children(this);
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::vector(&local_40,__x);
  transform((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
             *)local_28,&local_40);
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector(&local_40);
  __end1 = std::
           vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
           ::begin((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                    *)local_28);
  group = (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           *)std::
             vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
             ::end((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                    *)local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_*,_std::vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>_>
                                     *)&group), bVar1) {
    group_set._M_h._M_single_bucket =
         (__node_base_ptr)
         __gnu_cxx::
         __normal_iterator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_*,_std::vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>_>
         ::operator*(&__end1);
    local_b0._M_current =
         (shared_ptr<docopt::Pattern> *)
         std::
         vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         ::begin((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  *)group_set._M_h._M_single_bucket);
    local_b8._M_current =
         (shared_ptr<docopt::Pattern> *)
         std::
         vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         ::end((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                *)group_set._M_h._M_single_bucket);
    std::allocator<std::shared_ptr<docopt::Pattern>_>::allocator
              ((allocator<std::shared_ptr<docopt::Pattern>_> *)((long)&__range2 + 5));
    std::
    unordered_multiset<std::shared_ptr<docopt::Pattern>,docopt::PatternHasher,std::equal_to<std::shared_ptr<docopt::Pattern>>,std::allocator<std::shared_ptr<docopt::Pattern>>>
    ::
    unordered_multiset<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>const*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
              ((unordered_multiset<std::shared_ptr<docopt::Pattern>,docopt::PatternHasher,std::equal_to<std::shared_ptr<docopt::Pattern>>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                *)local_a8,local_b0,local_b8,0,(hasher *)((long)&__range2 + 7),
               (key_equal *)((long)&__range2 + 6),
               (allocator<std::shared_ptr<docopt::Pattern>_> *)((long)&__range2 + 5));
    std::allocator<std::shared_ptr<docopt::Pattern>_>::~allocator
              ((allocator<std::shared_ptr<docopt::Pattern>_> *)((long)&__range2 + 5));
    __end2 = std::
             unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             ::begin((unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      *)local_a8);
    e = (shared_ptr<docopt::Pattern> *)
        std::
        unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ::end((unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               *)local_a8);
    while (bVar1 = std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::shared_ptr<docopt::Pattern>,_true>,
                              (_Node_iterator_base<std::shared_ptr<docopt::Pattern>,_true> *)&e),
          bVar1) {
      this_00 = &std::__detail::_Node_iterator<std::shared_ptr<docopt::Pattern>,_true,_true>::
                 operator*(&__end2)->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>
      ;
      sVar3 = std::
              unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ::count((unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                       *)local_a8,(key_type *)this_00);
      if (sVar3 != 1) {
        peVar4 = std::__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
        if (peVar4 == (element_type *)0x0) {
          local_1b8 = (LeafPattern *)0x0;
        }
        else {
          local_1b8 = (LeafPattern *)
                      __dynamic_cast(peVar4,&Pattern::typeinfo,&LeafPattern::typeinfo,0);
        }
        if (local_1b8 != (LeafPattern *)0x0) {
          o._7_1_ = false;
          bVar1 = false;
          if (local_1b8 == (LeafPattern *)0x0) {
            local_1c8 = 0;
          }
          else {
            local_1c8 = __dynamic_cast(local_1b8,&LeafPattern::typeinfo,&Command::typeinfo,0);
          }
          if (local_1c8 == 0) {
            if (local_1b8 == (LeafPattern *)0x0) {
              local_1d8 = 0;
            }
            else {
              local_1d8 = __dynamic_cast(local_1b8,&LeafPattern::typeinfo,&Argument::typeinfo,0);
            }
            if (local_1d8 == 0) {
              if (local_1b8 == (LeafPattern *)0x0) {
                local_1e8 = (Option *)0x0;
              }
              else {
                local_1e8 = (Option *)
                            __dynamic_cast(local_1b8,&LeafPattern::typeinfo,&Option::typeinfo,0);
              }
              newValue.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1e8;
              if (local_1e8 != (Option *)0x0) {
                iVar2 = Option::argCount(local_1e8);
                bVar1 = iVar2 == 0;
                o._7_1_ = !bVar1;
              }
            }
            else {
              o._7_1_ = true;
            }
          }
          else {
            bVar1 = true;
          }
          if (o._7_1_) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_110);
            pvVar5 = LeafPattern::getValue(local_1b8);
            bVar1 = docopt::value::isString(pvVar5);
            if (bVar1) {
              pvVar5 = LeafPattern::getValue(local_1b8);
              str = docopt::value::asString_abi_cxx11_(pvVar5);
              anon_unknown.dwarf_108a86::split(&local_128,str,0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_110,&local_128);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_128);
            }
            pvVar5 = LeafPattern::getValue(local_1b8);
            bVar1 = docopt::value::isStringList(pvVar5);
            if (!bVar1) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_168,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_110);
              docopt::value::value(&local_150,&local_168);
              LeafPattern::setValue(local_1b8,&local_150);
              docopt::value::~value(&local_150);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_168);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_110);
          }
          else if (bVar1) {
            docopt::value::value(&local_190,0);
            LeafPattern::setValue(local_1b8,&local_190);
            docopt::value::~value(&local_190);
          }
        }
      }
      std::__detail::_Node_iterator<std::shared_ptr<docopt::Pattern>,_true,_true>::operator++
                (&__end2);
    }
    std::
    unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ::~unordered_multiset
              ((unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                *)local_a8);
    __gnu_cxx::
    __normal_iterator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_*,_std::vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ::~vector((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
             *)local_28);
  return;
}

Assistant:

inline void BranchPattern::fix_repeating_arguments()
	{
		std::vector<PatternList> either = transform(children());
		for(auto const& group : either) {
			// use multiset to help identify duplicate entries
			std::unordered_multiset<std::shared_ptr<Pattern>, PatternHasher> group_set {group.begin(), group.end()};
			for(auto const& e : group_set) {
				if (group_set.count(e) == 1)
					continue;

				LeafPattern* leaf = dynamic_cast<LeafPattern*>(e.get());
				if (!leaf) continue;

				bool ensureList = false;
				bool ensureInt = false;

				if (dynamic_cast<Command*>(leaf)) {
					ensureInt = true;
				} else if (dynamic_cast<Argument*>(leaf)) {
					ensureList = true;
				} else if (Option* o = dynamic_cast<Option*>(leaf)) {
					if (o->argCount()) {
						ensureList = true;
					} else {
						ensureInt = true;
					}
				}

				if (ensureList) {
					std::vector<std::string> newValue;
					if (leaf->getValue().isString()) {
						newValue = split(leaf->getValue().asString());
					}
					if (!leaf->getValue().isStringList()) {
						leaf->setValue(value{newValue});
					}
				} else if (ensureInt) {
					leaf->setValue(value{0});
				}
			}
		}
	}